

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_wall_distance_static(REF_GRID ref_grid,REF_DICT ref_dict,REF_DBL *distance)

{
  int iVar1;
  REF_INT RVar2;
  REF_NODE pRVar3;
  uint uVar4;
  REF_INT *pRVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  REF_DBL *pRVar9;
  char *pcVar10;
  REF_MPI ref_mpi;
  ulong uVar11;
  long lVar12;
  long lVar13;
  REF_INT ncell;
  REF_INT part_complete;
  ulong local_b8;
  REF_DBL *local_b0;
  REF_SEARCH ref_search;
  REF_DBL *xyz;
  int local_94;
  REF_INT local_node_per;
  REF_INT local_ncell;
  REF_INT *local_88;
  REF_MPI local_80;
  REF_DBL *local_78;
  REF_INT *local_70;
  REF_GRID local_68;
  ulong local_60;
  REF_DBL radius;
  REF_DBL *local_xyz;
  REF_DBL center [3];
  
  ref_mpi = ref_grid->mpi;
  pRVar3 = ref_grid->node;
  iVar1 = ref_grid->twod;
  uVar6 = 0;
  uVar11 = (ulong)(uint)pRVar3->max;
  if (pRVar3->max < 1) {
    uVar11 = uVar6;
  }
  for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
    if (-1 < pRVar3->global[uVar6]) {
      distance[uVar6] = 1e+200;
    }
  }
  uVar8 = (iVar1 == 0) + 2;
  uVar4 = ref_phys_local_wall(ref_grid,ref_dict,&local_node_per,&local_ncell,&local_xyz);
  if (uVar4 == 0) {
    if (uVar8 == local_node_per) {
      if (-1 < (long)ref_mpi->n) {
        pRVar5 = (REF_INT *)malloc((long)ref_mpi->n << 2);
        if (pRVar5 == (REF_INT *)0x0) {
          pcVar10 = "malloc part_ncell of REF_INT NULL";
          uVar7 = 0x687;
LAB_001a8b57:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 uVar7,"ref_phys_wall_distance_static",pcVar10);
          return 2;
        }
        local_b8 = (ulong)uVar8;
        uVar4 = ref_mpi_allgather(ref_mpi,&local_ncell,pRVar5,1);
        if (uVar4 == 0) {
          part_complete = 0;
          local_94 = (int)local_b8 * 3;
          local_78 = local_xyz;
          local_70 = pRVar5;
          while( true ) {
            pRVar9 = local_78;
            if (ref_mpi->n <= part_complete) {
              free(local_70);
              free(pRVar9);
              return 0;
            }
            xyz = (REF_DBL *)0x0;
            ncell = 0;
            uVar4 = ref_phys_bcast_parts
                              (ref_mpi,&part_complete,local_70,(REF_INT)local_b8,(REF_INT)local_78,
                               (REF_DBL *)&ncell,(REF_INT *)&xyz,
                               (REF_DBL **)((ulong)(uint)part_complete << 0x20));
            RVar2 = ncell;
            if (uVar4 != 0) {
              pcVar10 = "bcast part";
              uVar7 = 0x699;
              goto LAB_001a8ead;
            }
            uVar11 = (ulong)(uint)ncell;
            uVar4 = ref_search_create(&ref_search,ncell);
            if (uVar4 != 0) break;
            if (RVar2 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x69e,"ref_phys_wall_distance_static","malloc permutation of REF_INT negative"
                    );
              return 1;
            }
            pRVar5 = (REF_INT *)malloc(uVar11 * 4);
            if (pRVar5 == (REF_INT *)0x0) {
              pcVar10 = "malloc permutation of REF_INT NULL";
              uVar7 = 0x69e;
              goto LAB_001a8b57;
            }
            local_60 = uVar11;
            uVar4 = ref_sort_shuffle(RVar2,pRVar5);
            if (uVar4 != 0) {
              pcVar10 = "shuffle";
              uVar7 = 0x69f;
LAB_001a8ead:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,uVar7,"ref_phys_wall_distance_static",(ulong)uVar4,pcVar10);
              return uVar4;
            }
            local_b0 = xyz;
            uVar11 = 0;
            local_88 = pRVar5;
            local_80 = ref_mpi;
            local_68 = ref_grid;
            while (ref_grid = local_68, local_60 != uVar11) {
              RVar2 = local_88[uVar11];
              uVar4 = ref_node_bounding_sphere_xyz
                                (local_b0 + local_94 * RVar2,(REF_INT)local_b8,center,&radius);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x6a4,"ref_phys_wall_distance_static",(ulong)uVar4,"bound");
                return uVar4;
              }
              uVar4 = ref_search_insert(ref_search,RVar2,center,radius * 1.00000001);
              uVar11 = uVar11 + 1;
              if (uVar4 != 0) {
                pcVar10 = "ins";
                uVar7 = 0x6a5;
                goto LAB_001a8ead;
              }
            }
            free(local_88);
            lVar13 = 0;
            pRVar9 = distance;
            for (lVar12 = 0; lVar12 < pRVar3->max; lVar12 = lVar12 + 1) {
              if ((-1 < pRVar3->global[lVar12]) &&
                 (uVar4 = ref_search_nearest_element
                                    (ref_search,(REF_INT)local_b8,local_b0,
                                     (REF_DBL *)((long)ref_grid->node->real + lVar13),pRVar9),
                 uVar4 != 0)) {
                pcVar10 = "candidates";
                uVar7 = 0x6b5;
                goto LAB_001a8ead;
              }
              lVar13 = lVar13 + 0x78;
              pRVar9 = pRVar9 + 1;
            }
            uVar4 = ref_search_free(ref_search);
            if (uVar4 != 0) {
              pcVar10 = "free";
              uVar7 = 0x6b7;
              goto LAB_001a8ead;
            }
            free(local_b0);
            ref_mpi = local_80;
          }
          pcVar10 = "make search";
          uVar7 = 0x69d;
        }
        else {
          pcVar10 = "allgather part ncell";
          uVar7 = 0x689;
        }
        goto LAB_001a8a3d;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x687,
             "ref_phys_wall_distance_static","malloc part_ncell of REF_INT negative");
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x685,
             "ref_phys_wall_distance_static","node_per miss match",(ulong)uVar8,(long)local_node_per
            );
    }
    uVar4 = 1;
  }
  else {
    pcVar10 = "local wall";
    uVar7 = 0x684;
LAB_001a8a3d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar7,
           "ref_phys_wall_distance_static",(ulong)uVar4,pcVar10);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_phys_wall_distance_static(REF_GRID ref_grid,
                                                 REF_DICT ref_dict,
                                                 REF_DBL *distance) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ncell, local_ncell, *part_ncell, part_complete, max_ncell;
  REF_DBL *local_xyz, *xyz;
  REF_INT local_node_per, node_per;
  REF_INT node, cell;
  REF_INT *permutation, i;
  REF_SEARCH ref_search;
  REF_DBL center[3], radius;
  REF_DBL scale = 1.0 + 1.0e-8;
  REF_BOOL timing = REF_FALSE;

  if (timing) ref_mpi_stopwatch_start(ref_mpi);

  if (ref_grid_twod(ref_grid)) {
    node_per = 2;
  } else {
    node_per = 3;
  }

  each_ref_node_valid_node(ref_node, node) { distance[node] = REF_DBL_MAX; }

  RSS(ref_phys_local_wall(ref_grid, ref_dict, &local_node_per, &local_ncell,
                          &local_xyz),
      "local wall");
  REIS(node_per, local_node_per, "node_per miss match");

  ref_malloc(part_ncell, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &local_ncell, part_ncell, REF_INT_TYPE),
      "allgather part ncell");
  if (timing && ref_mpi_once(ref_mpi)) {
    for (i = 0; i < ref_mpi_n(ref_mpi); i++) {
      printf("%d part %d ncell\n", i, part_ncell[i]);
    }
  }
  if (timing) ref_mpi_stopwatch_stop(ref_mpi, "wall dist init");

  max_ncell = 1000000; /* (8 * 3 * node_per) bytes per element */

  part_complete = 0;
  while (part_complete < ref_mpi_n(ref_mpi)) {
    xyz = NULL;
    ncell = 0;
    RSS(ref_phys_bcast_parts(ref_mpi, &part_complete, part_ncell, max_ncell,
                             node_per, local_xyz, &ncell, &xyz),
        "bcast part");

    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "form-scatter");

    RSS(ref_search_create(&ref_search, ncell), "make search");
    ref_malloc(permutation, ncell, REF_INT);
    RSS(ref_sort_shuffle(ncell, permutation), "shuffle");
    for (i = 0; i < ncell; i++) {
      cell = permutation[i];
      RSS(ref_node_bounding_sphere_xyz(&(xyz[3 * node_per * cell]), node_per,
                                       center, &radius),
          "bound");
      RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
    }
    ref_free(permutation);
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "create-insert");
    if (timing && ref_mpi_once(ref_mpi)) {
      REF_INT depth;
      RSS(ref_search_depth(ref_search, &depth), "depth");
      printf("ncell %d depth %d\n", ncell, depth);
    }
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "depth");

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_search_nearest_element(
              ref_search, node_per, xyz,
              ref_node_xyz_ptr(ref_grid_node(ref_grid), node),
              &(distance[node])),
          "candidates");
    }
    RSS(ref_search_free(ref_search), "free");

    ref_free(xyz);
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "min(dist)");
  }

  ref_free(part_ncell);
  ref_free(local_xyz);
  return REF_SUCCESS;
}